

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrace.cpp
# Opt level: O3

void outputChar(char c,char *outBuf,int32_t *outIx,int32_t capacity,int32_t indent)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = *outIx;
  uVar3 = (ulong)(int)uVar2;
  if (uVar3 == 0) {
LAB_001917ab:
    if (indent < 1) goto LAB_001917c5;
  }
  else {
    if (c == '\0') goto LAB_001917c5;
    if (c == '\n') {
      if ((int)uVar2 < capacity || indent < 1) goto LAB_001917c5;
    }
    else {
      if (((int)uVar2 < capacity) && (outBuf[uVar3 - 1] == '\n')) goto LAB_001917ab;
      if (((int)uVar2 < capacity || c != '\n') || indent < 1) goto LAB_001917c5;
    }
  }
  do {
    iVar1 = (int)uVar3;
    if (iVar1 < capacity) {
      outBuf[iVar1] = ' ';
      iVar1 = *outIx;
    }
    uVar2 = iVar1 + 1;
    uVar3 = (ulong)uVar2;
    *outIx = uVar2;
    indent = indent + -1;
  } while (indent != 0);
LAB_001917c5:
  if ((int)uVar2 < capacity) {
    outBuf[(int)uVar2] = c;
  }
  if (c != '\0') {
    *outIx = *outIx + 1;
  }
  return;
}

Assistant:

static void outputChar(char c, char *outBuf, int32_t *outIx, int32_t capacity, int32_t indent) {
    int32_t i;
    /* Check whether a start of line indenting is needed.  Three cases:
     *   1.  At the start of the first line  (output index == 0).
     *   2.  At the start of subsequent lines  (preceeding char in buffer == '\n')
     *   3.  When preflighting buffer len (buffer capacity is exceeded), when
     *       a \n is output.  Ideally we wouldn't do the indent until the following char
     *       is received, but that won't work because there's no place to remember that
     *       the preceding char was \n.  Meaning that we may overstimate the
     *       buffer size needed.  No harm done.
     */
    if (*outIx==0 ||   /* case 1. */
        (c!='\n' && c!=0 && *outIx < capacity && outBuf[(*outIx)-1]=='\n') ||  /* case 2. */
        (c=='\n' && *outIx>=capacity))    /* case 3 */
    {
        /* At the start of a line.  Indent. */
        for(i=0; i<indent; i++) {
            if (*outIx < capacity) {
                outBuf[*outIx] = ' ';
            }
            (*outIx)++;
        }
    }

    if (*outIx < capacity) {
        outBuf[*outIx] = c;
    }
    if (c != 0) {
        /* Nulls only appear as end-of-string terminators.  Move them to the output
         *  buffer, but do not update the length of the buffer, so that any
         *  following output will overwrite the null. */
        (*outIx)++;
    }
}